

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

ulong tidyOptGetInt(TidyDoc tdoc,TidyOptionId optId)

{
  ulong local_28;
  ulong opti;
  TidyDocImpl *impl;
  TidyOptionId optId_local;
  TidyDoc tdoc_local;
  
  local_28 = 0;
  if (tdoc != (TidyDoc)0x0) {
    if (optId == TidyDoctype) {
      local_28 = *(ulong *)(tdoc + 0x38);
    }
    else {
      local_28 = *(ulong *)(tdoc + (ulong)optId * 2 + 0x1c);
    }
  }
  return local_28;
}

Assistant:

ulong TIDY_CALL        tidyOptGetInt( TidyDoc tdoc, TidyOptionId optId )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ulong opti = 0;
    if ( impl )
    {
        /* Special case for TidyDoctype, because it has a picklist */
        if ( optId == TidyDoctype )
            opti = cfg( impl, TidyDoctypeMode);
        else
            opti = cfg( impl, optId );
    }
    return opti;
}